

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::setPositivePrefix(DecimalFormat *this,UnicodeString *newValue)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  uint in_EAX;
  int iVar4;
  int len;
  DecimalFormatProperties *pDVar5;
  bool bVar6;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  pDVar5 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  uVar1 = (newValue->fUnion).fStackFields.fLengthAndFlags;
  uStack_18._0_4_ = in_EAX;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = (newValue->fUnion).fFields.fLength;
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = (pDVar5->positivePrefix).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar4 = (pDVar5->positivePrefix).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar2 >> 5;
    }
    if ((((int)sVar2 & 1U) != 0) || (len != iVar4)) goto LAB_00245cf5;
    UVar3 = UnicodeString::doEquals(newValue,&pDVar5->positivePrefix,len);
    bVar6 = UVar3 != '\0';
  }
  else {
    bVar6 = (bool)(*(byte *)&(pDVar5->positivePrefix).fUnion & 1);
  }
  if (bVar6 != false) {
    return;
  }
  pDVar5 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
LAB_00245cf5:
  UnicodeString::operator=(&pDVar5->positivePrefix,newValue);
  uStack_18 = (ulong)(uint)uStack_18;
  touch(this,(UErrorCode *)((long)&uStack_18 + 4));
  return;
}

Assistant:

void DecimalFormat::setPositivePrefix(const UnicodeString& newValue) {
    if (newValue == fields->properties->positivePrefix) { return; }
    fields->properties->positivePrefix = newValue;
    touchNoError();
}